

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O0

CommandSignature __thiscall llbuild::buildsystem::BuildNode::getSignature(BuildNode *this)

{
  bool bVar1;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *this_00
  ;
  reference ppCVar2;
  StringRef string;
  Command *producer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *__range1;
  BuildNode *this_local;
  CommandSignature sig;
  
  llbuild::basic::CommandSignature::CommandSignature((CommandSignature *)&this_local);
  llbuild::basic::CommandSignature::combine((CommandSignature *)&this_local,this->type != Plain);
  this_00 = Node::getProducers(&this->super_Node);
  __end1 = std::
           vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
           ::begin(this_00);
  producer = (Command *)
             std::
             vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
             ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llbuild::buildsystem::Command_*const_*,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
                                *)&producer);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::Command_*const_*,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
              ::operator*(&__end1);
    string = Command::getName(*ppCVar2);
    llbuild::basic::CommandSignature::combine((CommandSignature *)&this_local,string);
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::Command_*const_*,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
    ::operator++(&__end1);
  }
  return (CommandSignature)(uint64_t)this_local;
}

Assistant:

basic::CommandSignature BuildNode::getSignature() const {
  basic::CommandSignature sig;
  sig.combine(static_cast<unsigned int>(type));
  // We include the name of all producer rules in the signature to ensure that
  // we properly pick up changes in build graph structure.  For example, a node
  // that was previously a plain input that has changed to become a produced
  // node.
  for (auto* producer : getProducers()) {
    sig.combine(producer->getName());
  }
  return sig;
}